

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_sort.c
# Opt level: O2

REF_STATUS ref_sort_heap_dbl(REF_INT n,REF_DBL *original,REF_INT *sorted_index)

{
  int iVar1;
  int iVar2;
  ulong uVar3;
  uint uVar4;
  ulong uVar5;
  long lVar6;
  uint uVar7;
  int iVar8;
  int iVar9;
  REF_DBL RVar10;
  
  uVar3 = 0;
  uVar5 = 0;
  if (0 < n) {
    uVar5 = (ulong)(uint)n;
  }
  for (; uVar5 != uVar3; uVar3 = uVar3 + 1) {
    sorted_index[uVar3] = (REF_INT)uVar3;
  }
  if (n < 2) {
    return 0;
  }
  uVar4 = ((uint)n >> 1) + 1;
  uVar7 = n - 1;
  do {
    if ((int)uVar4 < 2) {
      iVar8 = sorted_index[uVar7];
      RVar10 = original[iVar8];
      sorted_index[uVar7] = *sorted_index;
      uVar7 = uVar7 - 1;
      if (uVar7 == 0) {
        *sorted_index = iVar8;
        return 0;
      }
      uVar4 = 1;
    }
    else {
      uVar3 = (ulong)uVar4;
      uVar4 = uVar4 - 1;
      iVar8 = sorted_index[uVar3 - 2];
      RVar10 = original[iVar8];
    }
    iVar2 = uVar4 * 2 + -1;
    iVar1 = uVar4 - 1;
    while (iVar9 = iVar2, iVar9 <= (int)uVar7) {
      lVar6 = (long)iVar9;
      if ((iVar9 < (int)uVar7) &&
         (original[sorted_index[lVar6]] <= original[sorted_index[lVar6 + 1]] &&
          original[sorted_index[lVar6 + 1]] != original[sorted_index[lVar6]])) {
        iVar9 = iVar9 + 1;
        lVar6 = lVar6 + 1;
      }
      if (original[sorted_index[lVar6]] <= RVar10) break;
      sorted_index[iVar1] = sorted_index[lVar6];
      iVar1 = iVar9;
      iVar2 = iVar9 * 2 + 1;
    }
    sorted_index[iVar1] = iVar8;
  } while( true );
}

Assistant:

REF_FCN REF_STATUS ref_sort_heap_dbl(REF_INT n, REF_DBL *original,
                                     REF_INT *sorted_index) {
  REF_INT i, j, l, ir, indxt;
  REF_DBL q;

  for (i = 0; i < n; i++) sorted_index[i] = i;

  if (n < 2) return REF_SUCCESS;

  l = (n >> 1) + 1;
  ir = n - 1;
  for (;;) {
    if (l > 1) {
      l--;
      indxt = sorted_index[l - 1];
      q = original[indxt];
    } else {
      indxt = sorted_index[ir];
      q = original[indxt];
      sorted_index[ir] = sorted_index[0];
      if (--ir == 0) {
        sorted_index[0] = indxt;
        break;
      }
    }
    i = l - 1;
    j = l + i;

    while (j <= ir) {
      if (j < ir) {
        if (original[sorted_index[j]] < original[sorted_index[j + 1]]) j++;
      }
      if (q < original[sorted_index[j]]) {
        sorted_index[i] = sorted_index[j];
        i = j;

        j++;
        j <<= 1;
        j--;

      } else
        break;
    }
    sorted_index[i] = indxt;
  }

  return REF_SUCCESS;
}